

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_properties.h
# Opt level: O0

bool __thiscall
BamTools::PropertyFilterValue::check<unsigned_int>(PropertyFilterValue *this,uint *query)

{
  bool bVar1;
  ostream *poVar2;
  uint *puVar3;
  uint *in_RSI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffc4;
  bool local_1;
  
  bVar1 = Variant::is_type<unsigned_int>
                    ((Variant *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (bVar1) {
    bVar1 = Variant::is_type<std::__cxx11::string>
                      ((Variant *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "Cannot compare different types - query is a string!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      local_1 = false;
    }
    else {
      switch(*(undefined4 *)(in_RDI + 8)) {
      case 2:
        uVar4 = *in_RSI;
        puVar3 = Variant::get<unsigned_int>((Variant *)0x21536e);
        local_1 = uVar4 == *puVar3;
        break;
      case 3:
        uVar4 = *in_RSI;
        puVar3 = Variant::get<unsigned_int>((Variant *)0x21539a);
        local_1 = *puVar3 < uVar4;
        break;
      case 4:
        uVar4 = *in_RSI;
        puVar3 = Variant::get<unsigned_int>((Variant *)0x2153c6);
        local_1 = *puVar3 <= uVar4;
        break;
      case 5:
        uVar4 = *in_RSI;
        puVar3 = Variant::get<unsigned_int>((Variant *)0x2153f2);
        local_1 = uVar4 < *puVar3;
        break;
      case 6:
        uVar4 = *in_RSI;
        puVar3 = Variant::get<unsigned_int>((Variant *)0x21541b);
        local_1 = uVar4 <= *puVar3;
        break;
      case 7:
        uVar4 = *in_RSI;
        puVar3 = Variant::get<unsigned_int>((Variant *)0x215444);
        local_1 = uVar4 != *puVar3;
        break;
      default:
        bamtools_noop();
        local_1 = false;
      }
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Cannot compare different types!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool PropertyFilterValue::check(const T& query) const
{

    // ensure filter value & query are same type
    if (!Value.is_type<T>()) {
        std::cerr << "Cannot compare different types!" << std::endl;
        return false;
    }

    // string matching
    if (Value.is_type<std::string>()) {
        std::cerr << "Cannot compare different types - query is a string!" << std::endl;
        return false;
    }

    // numeric matching based on our filter type
    switch (Type) {
        case (PropertyFilterValue::EXACT):
            return (query == Value.get<T>());
        case (PropertyFilterValue::GREATER_THAN):
            return (query > Value.get<T>());
        case (PropertyFilterValue::GREATER_THAN_EQUAL):
            return (query >= Value.get<T>());
        case (PropertyFilterValue::LESS_THAN):
            return (query < Value.get<T>());
        case (PropertyFilterValue::LESS_THAN_EQUAL):
            return (query <= Value.get<T>());
        case (PropertyFilterValue::NOT):
            return (query != Value.get<T>());
        default:
            BAMTOOLS_ASSERT_UNREACHABLE;
    }
    return false;
}